

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cdn_describe_cdn_service.cc
# Opt level: O0

void anon_unknown.dwarf_2b9bb::Json2Type(Value *value,CdnDescribeCdnServiceResponseType *item)

{
  bool bVar1;
  Value *pVVar2;
  Json2Array<aliyun::CdnDescribeCdnServiceLockReasonType> local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  CdnDescribeCdnServiceResponseType *local_18;
  CdnDescribeCdnServiceResponseType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (CdnDescribeCdnServiceResponseType *)value;
  bVar1 = Json::Value::isMember(value,"InternetChargeType");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"InternetChargeType");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->internet_charge_type,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"OpeningTime");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"OpeningTime");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->opening_time,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"ChangingChargeType");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"ChangingChargeType");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->changing_charge_type,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"ChangingAffectTime");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"ChangingAffectTime");
    Json::Value::asString_abi_cxx11_(&local_98,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->changing_affect_time,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"OperationLocks");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"OperationLocks");
    bVar1 = Json::Value::isMember(pVVar2,"LockReason");
    if (bVar1) {
      pVVar2 = Json::Value::operator[]((Value *)item_local,"OperationLocks");
      pVVar2 = Json::Value::operator[](pVVar2,"LockReason");
      Json2Array<aliyun::CdnDescribeCdnServiceLockReasonType>::Json2Array
                (&local_99,pVVar2,&local_18->operation_locks);
    }
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, CdnDescribeCdnServiceResponseType* item) {
  if(value.isMember("InternetChargeType")) {
    item->internet_charge_type = value["InternetChargeType"].asString();
  }
  if(value.isMember("OpeningTime")) {
    item->opening_time = value["OpeningTime"].asString();
  }
  if(value.isMember("ChangingChargeType")) {
    item->changing_charge_type = value["ChangingChargeType"].asString();
  }
  if(value.isMember("ChangingAffectTime")) {
    item->changing_affect_time = value["ChangingAffectTime"].asString();
  }
  if(value.isMember("OperationLocks") && value["OperationLocks"].isMember("LockReason")) {
    Json2Array<CdnDescribeCdnServiceLockReasonType>(value["OperationLocks"]["LockReason"], &item->operation_locks);
  }
}